

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

void __thiscall Js::CompoundString::AppendCharsSz(CompoundString *this,char16 *s)

{
  bool bVar1;
  size_t charCount;
  
  charCount = PAL_wcslen(s);
  bVar1 = IsValidCharCount(charCount);
  if (bVar1) {
    AppendGeneric<Js::CompoundString>(s,(CharCount)charCount,this,true);
    return;
  }
  JavascriptExceptionOperators::ThrowOutOfMemory
            ((((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.type.ptr)
               ->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
}

Assistant:

void CompoundString::AppendCharsSz(__in_z const char16 *const s)
    {
        size_t len = wcslen(s);
        // We limit the length of the string to MaxCharCount,
        // so just OOM if we are appending a string that exceed this limit already
        if (!IsValidCharCount(len))
        {
            JavascriptExceptionOperators::ThrowOutOfMemory(this->GetScriptContext());
        }
        AppendChars(s, (CharCount)len);
    }